

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O0

double one_res_en_loodis_all_list
                 (Structure *Conf,Residue *res,vector<int,_std::allocator<int>_> *List)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_type sVar8;
  const_reference pvVar9;
  double dVar10;
  int List_size;
  int numatom1;
  int position;
  int atomIndex2;
  int atomIndex1;
  double energy;
  double dis;
  int numatom2;
  int disInd;
  int p;
  int k;
  int j;
  int i;
  vector<int,_std::allocator<int>_> *List_local;
  Residue *res_local;
  Structure *Conf_local;
  
  _atomIndex2 = 0.0;
  iVar6 = (int)res->_posn;
  sVar1 = res->_numAtom;
  sVar8 = std::vector<int,_std::allocator<int>_>::size(List);
  for (numatom2 = 0; numatom2 < (int)sVar8; numatom2 = numatom2 + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](List,(long)numatom2);
    iVar3 = *pvVar9;
    if (((((iVar6 + 2 <= iVar3) || (iVar3 <= iVar6 + -2)) &&
         ((dVar10 = Conf->_res[iVar3]._center.super_Point.x, dVar10 != 0.0 ||
          ((NAN(dVar10) || (iVar3 == iVar6)))))) && (res->_atom[1]._type != -0x3039)) &&
       ((((Conf->_res[iVar3]._atom)->_type != -0x3039 &&
         ((dVar10 = res->_atom[1].super_Point.x, dVar10 != 0.0 || (NAN(dVar10))))) &&
        ((dVar10 = ((Conf->_res[iVar3]._atom)->super_Point).x, dVar10 != 0.0 || (NAN(dVar10))))))) {
      sVar2 = Conf->_res[iVar3]._numAtom;
      dVar10 = Point::dis(&(res->_center).super_Point,&Conf->_res[iVar3]._center.super_Point);
      if (dVar10 < 12.0) {
        for (p = 0; p < sVar1; p = p + 1) {
          uVar7 = VdwUtils::should_ignore_atom(res->_atom + p);
          if (uVar7 == 0) {
            for (disInd = 0; disInd < sVar2; disInd = disInd + 1) {
              uVar7 = VdwUtils::should_ignore_atom(Conf->_res[iVar3]._atom + disInd);
              if (uVar7 == 0) {
                iVar4 = res->_atom[p]._type;
                iVar5 = Conf->_res[iVar3]._atom[disInd]._type;
                dVar10 = Point::dis(&res->_atom[p].super_Point,
                                    &Conf->_res[iVar3]._atom[disInd].super_Point);
                if (dVar10 < 8.0) {
                  if ((res->_type == 1) && (Conf->_res[iVar3]._type == 1)) {
                    if ((((res->_atom[p]._type != 0x10) ||
                         (Conf->_res[iVar3]._atom[disInd]._type != 0x10)) || (dVar10 <= 1.8)) ||
                       (2.2 <= dVar10)) {
                      if ((((res->_atom[p]._type != 0x10) ||
                           (Conf->_res[iVar3]._atom[disInd]._type != 4)) &&
                          ((res->_atom[p]._type != 4 ||
                           (Conf->_res[iVar3]._atom[disInd]._type != 0x10)))) ||
                         ((dVar10 <= 2.7 || (3.3 <= dVar10)))) {
                        _atomIndex2 = PF::LOODIS[iVar4 + -1][iVar5 + -1][(int)(dVar10 / 0.1)] +
                                      _atomIndex2;
                      }
                      else {
                        _atomIndex2 = _atomIndex2 + -2.0;
                      }
                    }
                    else {
                      _atomIndex2 = _atomIndex2 + -2.5;
                    }
                  }
                  else {
                    _atomIndex2 = PF::LOODIS[iVar4 + -1][iVar5 + -1][(int)(dVar10 / 0.1)] +
                                  _atomIndex2;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _atomIndex2;
}

Assistant:

double one_res_en_loodis_all_list(const Structure &Conf, const Residue &res, const std::vector<int> &List) {
    int i, j, k, p, disInd, numatom2;
    double dis;
    double energy = 0;
    int atomIndex1, atomIndex2;

    // get the position of res to check for adjacent residues
    // @TODO - verify this is initialized properly
    const int position = res._posn;

    const int numatom1 = res._numAtom;

    const int List_size = static_cast<int>(List.size());

    for (p = 0; p < List_size; p++) {
        i = List[p];

        // exclude neighbor residue
        if (i < position + 2 && i > position - 2)
            continue;

        // exclude residues with x center at 0 -> uninitialized?
        // @TODO - verify this
        if (Conf._res[i]._center.x == 0) {
            if (i != position)
                continue;
        }

        // skip past uninitialized residues and atom positions
        if (res._atom[1]._type == UNDEF || Conf._res[i]._atom[0]._type == UNDEF || res._atom[1].x == 0. ||
            Conf._res[i]._atom[0].x == 0.)
            continue;

        numatom2 = Conf._res[i]._numAtom;

        if (res._center.dis(Conf._res[i]._center) < CC_DIS_CUT) {
            for (j = 0; j < numatom1; ++j) {
                if (VdwUtils::should_ignore_atom(res._atom[j])) { continue; }
                for (k = 0; k < numatom2; ++k) {
                    if (VdwUtils::should_ignore_atom(Conf._res[i]._atom[k])) { continue; }
                    atomIndex1 = res._atom[j]._type;
                    atomIndex2 = Conf._res[i]._atom[k]._type;
                    dis = res._atom[j].dis(Conf._res[i]._atom[k]);
                    if (dis < (H_INLO * LOODIS_DIS_BIN)) {
                        disInd = (int) (dis / H_INLO);
                        if (res._type == 1 && Conf._res[i]._type == 1) {
                            if ((res._atom[j]._type == 16) && (Conf._res[i]._atom[k]._type == 16) &&
                                (dis > 1.8 && dis < 2.2)) {
                                energy += -2.5;
                            }
                            else if (((res._atom[j]._type == 16 && Conf._res[i]._atom[k]._type == 4) ||
                                      (res._atom[j]._type == 4 && Conf._res[i]._atom[k]._type == 16)) &&
                                     (dis > 2.7 && dis < 3.3)) {
                                energy += -2;
                            }
                            else
                                energy += PF::LOODIS[atomIndex1 - 1][atomIndex2 - 1][disInd];
                        }
                        else
                            energy += PF::LOODIS[atomIndex1 - 1][atomIndex2 - 1][disInd];
                    }
                }
            }
        }
    }

    return energy;
}